

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServerBase::AddNewConnection(cmServerBase *this,cmConnection *ownedConnection)

{
  undefined1 local_28 [8];
  unique_lock<cm::shared_mutex> lock;
  cmConnection *ownedConnection_local;
  cmServerBase *this_local;
  
  lock._8_8_ = ownedConnection;
  std::unique_lock<cm::shared_mutex>::unique_lock
            ((unique_lock<cm::shared_mutex> *)local_28,&this->ConnectionsMutex);
  std::
  vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>
  ::emplace_back<cmConnection*&>
            ((vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>
              *)&this->Connections,(cmConnection **)&lock._M_owns);
  std::unique_lock<cm::shared_mutex>::~unique_lock((unique_lock<cm::shared_mutex> *)local_28);
  (**(code **)(*(long *)lock._8_8_ + 0x28))(lock._8_8_,this);
  return;
}

Assistant:

void cmServerBase::AddNewConnection(cmConnection* ownedConnection)
{
  {
    std::unique_lock<cm::shared_mutex> lock(ConnectionsMutex);
    Connections.emplace_back(ownedConnection);
  }
  ownedConnection->SetServer(this);
}